

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdEncryptDecryptAES_CBC_Test::TestBody
          (cfdcapi_common_CfdEncryptDecryptAES_CBC_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char **in_stack_00000088;
  char *in_stack_00000090;
  char *in_stack_00000098;
  char *in_stack_000000a0;
  void *in_stack_000000a8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *exp_aes;
  char *target_data;
  char *output;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffdf8;
  AssertionResult *in_stack_fffffffffffffe00;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  char *in_stack_fffffffffffffe10;
  AssertionResult *in_stack_fffffffffffffe18;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)in_stack_fffffffffffffe18);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3273da);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x20f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x32743d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x327492);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(type *)0x3274c3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x210,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3275bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x327637);
  local_a0 = (char *)0x0;
  local_a8 = "74657374207465737420746573742074657374";
  local_b0 = "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22";
  local_14 = CfdEncryptAES(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                           in_stack_00000088);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x327734);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x21a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x327791);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3277e6);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ((internal *)&local_e8,"exp_aes","output",local_b0,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x32788a);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x21c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x3278e7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x32793c);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    local_a0 = (char *)0x0;
  }
  local_14 = CfdDecryptAES(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                           in_stack_00000088);
  local_10c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)in_stack_fffffffffffffe00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x327a2a);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x226,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x327a87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x327adc);
  if (local_14 == 0) {
    in_stack_fffffffffffffe18 = &local_130;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffffe18,"target_data","output",local_a8,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe18);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      in_stack_fffffffffffffe10 =
           testing::AssertionResult::failure_message((AssertionResult *)0x327b80);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x228,in_stack_fffffffffffffe10);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x327bdd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x327c32);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    local_a0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle((void *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  local_154 = 0;
  this_00 = &local_150;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffe18->success_,in_stack_fffffffffffffe10,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x327d02);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x22e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x327d5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x327db2);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdEncryptDecryptAES_CBC) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  const char* target_data = "74657374207465737420746573742074657374";
  const char* exp_aes = "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22";
  ret = CfdEncryptAES(handle,
      "616975656F616975656F616975656F616975656F616975656F616975656F6169",
      "33343536373839303132333435363738",
      target_data,
      &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp_aes, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdDecryptAES(handle,
      "616975656F616975656F616975656F616975656F616975656F616975656F6169",
      "33343536373839303132333435363738",
      exp_aes,
      &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(target_data, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}